

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.h
# Opt level: O0

cmCommand * __thiscall cmFLTKWrapUICommand::Clone(cmFLTKWrapUICommand *this)

{
  cmFLTKWrapUICommand *this_00;
  cmFLTKWrapUICommand *this_local;
  
  this_00 = (cmFLTKWrapUICommand *)operator_new(0x88);
  cmFLTKWrapUICommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmFLTKWrapUICommand;
    }